

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

void __thiscall
ExternalSigner::ExternalSigner
          (ExternalSigner *this,string *command,string chain,string *fingerprint,string name)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)this,command);
  std::__cxx11::string::string((string *)&this->m_chain,fingerprint);
  std::__cxx11::string::string((string *)&this->m_fingerprint,in_RCX);
  std::__cxx11::string::string((string *)&this->m_name,in_R8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ExternalSigner::ExternalSigner(const std::string& command, const std::string chain, const std::string& fingerprint, const std::string name): m_command(command), m_chain(chain), m_fingerprint(fingerprint), m_name(name) {}